

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O1

void brotli::CopyLiteralsToByteArray
               (Command *cmds,size_t num_commands,uint8_t *data,size_t offset,size_t mask,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *literals)

{
  Command *pCVar1;
  size_t sVar2;
  ulong uVar3;
  size_t __n;
  ulong __new_size;
  size_t __n_00;
  uint32_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  
  __new_size = 0;
  pCVar1 = cmds;
  sVar2 = num_commands;
  if (num_commands != 0) {
    do {
      __new_size = __new_size + pCVar1->insert_len_;
      sVar2 = sVar2 - 1;
      pCVar1 = pCVar1 + 1;
    } while (sVar2 != 0);
  }
  if ((__new_size != 0) &&
     (std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(literals,__new_size),
     num_commands != 0)) {
    puVar4 = &cmds->copy_len_;
    uVar5 = 1;
    uVar3 = 0;
    do {
      uVar6 = offset & mask;
      __n = (size_t)((Command *)(puVar4 + -1))->insert_len_;
      if (mask < uVar6 + __n) {
        __n_00 = (mask + 1) - uVar6;
        memcpy((literals->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start + uVar3,data + uVar6,__n_00);
        uVar3 = uVar3 + __n_00;
        __n = __n - __n_00;
        uVar6 = 0;
      }
      if (__n != 0) {
        memcpy((literals->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start + uVar3,data + uVar6,__n);
        uVar3 = uVar3 + __n;
      }
      if (num_commands <= uVar5) {
        return;
      }
      offset = (ulong)*puVar4 + __n + uVar6;
      uVar5 = uVar5 + 1;
      puVar4 = puVar4 + 6;
    } while (uVar3 < __new_size);
  }
  return;
}

Assistant:

void CopyLiteralsToByteArray(const Command* cmds,
                             const size_t num_commands,
                             const uint8_t* data,
                             const size_t offset,
                             const size_t mask,
                             std::vector<uint8_t>* literals) {
  // Count how many we have.
  size_t total_length = 0;
  for (size_t i = 0; i < num_commands; ++i) {
    total_length += cmds[i].insert_len_;
  }
  if (total_length == 0) {
    return;
  }

  // Allocate.
  literals->resize(total_length);

  // Loop again, and copy this time.
  size_t pos = 0;
  size_t from_pos = offset & mask;
  for (size_t i = 0; i < num_commands && pos < total_length; ++i) {
    size_t insert_len = cmds[i].insert_len_;
    if (from_pos + insert_len > mask) {
      size_t head_size = mask + 1 - from_pos;
      memcpy(&(*literals)[pos], data + from_pos, head_size);
      from_pos = 0;
      pos += head_size;
      insert_len -= head_size;
    }
    if (insert_len > 0) {
      memcpy(&(*literals)[pos], data + from_pos, insert_len);
      pos += insert_len;
    }
    from_pos = (from_pos + insert_len + cmds[i].copy_len_) & mask;
  }
}